

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_merging.h
# Opt level: O0

void __thiscall
shift_window_transformer::PatchMerging<float>::forward
          (PatchMerging<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  initializer_list<int> __l;
  int iVar5;
  TensorShape *this_00;
  const_reference pvVar6;
  size_type __new_size;
  const_reference pvVar7;
  reference pvVar8;
  int tmp_pos;
  int new_y;
  int new_x;
  int y;
  int x;
  int j;
  int i;
  int ch;
  int local_94;
  iterator local_90;
  undefined8 local_88;
  undefined1 local_70 [8];
  Tensor<float> tmp;
  int new_w;
  int new_h;
  int w;
  int h;
  int ch_sum;
  TensorShape *vec;
  Tensor<float> *output_local;
  Tensor<float> *input_local;
  PatchMerging<float> *this_local;
  
  this_00 = &input->shape;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0);
  iVar2 = *pvVar6;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,1);
  iVar3 = *pvVar6;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,2);
  iVar4 = *pvVar6;
  iVar5 = iVar3 / this->downscaling_factor;
  tmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = iVar4 / this->downscaling_factor;
  Tensor<float>::Tensor((Tensor<float> *)local_70);
  __new_size = std::vector<float,_std::allocator<float>_>::size
                         (&input->super_vector<float,_std::allocator<float>_>);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)local_70,__new_size);
  ch = tmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_;
  i = iVar5;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0);
  local_94 = *pvVar6 * this->downscaling_factor * this->downscaling_factor;
  local_90 = &i;
  local_88 = 3;
  __l._M_len = 3;
  __l._M_array = local_90;
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)
             &tmp.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__l);
  for (j = 0; j < iVar2; j = j + 1) {
    for (x = 0; x < iVar5; x = x + 1) {
      for (y = 0; y < tmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_; y = y + 1) {
        for (new_x = 0; new_x < this->downscaling_factor; new_x = new_x + 1) {
          for (new_y = 0; new_y < this->downscaling_factor; new_y = new_y + 1) {
            pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                               (&input->super_vector<float,_std::allocator<float>_>,
                                (long)(j * iVar3 * iVar4 +
                                       (x * this->downscaling_factor + new_x) * iVar4 +
                                       y * this->downscaling_factor + new_y));
            vVar1 = *pvVar7;
            pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                               ((vector<float,_std::allocator<float>_> *)local_70,
                                (long)(x * iVar2 * this->downscaling_factor *
                                       this->downscaling_factor *
                                       tmp.shape.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ +
                                       y * iVar2 +
                                       this->downscaling_factor * this->downscaling_factor +
                                       j * this->downscaling_factor * this->downscaling_factor +
                                       new_x * this->downscaling_factor + new_y));
            *pvVar8 = vVar1;
          }
        }
      }
    }
  }
  Linear<float>::forward(&this->layer,(Tensor<float> *)local_70,output);
  Tensor<float>::~Tensor((Tensor<float> *)local_70);
  return;
}

Assistant:

void forward(const Tensor<T> &input, Tensor<T> &output) {
            auto &vec = input.shape;
            int ch_sum = vec[0], h = vec[1], w = vec[2];
            int new_h = h / downscaling_factor, new_w = w / downscaling_factor;
            Tensor<T> tmp{};
            tmp.resize(input.size());
            tmp.shape = {new_h, new_w,
                         (vec[0] * downscaling_factor * downscaling_factor)};
            /*
             * Unfold and reshape
             */
            for (int ch = 0; ch < ch_sum; ++ch) {
                for (int i = 0; i < new_h; ++i) {
                    for (int j = 0; j < new_w; ++j) {
                        for (int x = 0; x < downscaling_factor; ++x) {
                            for (int y = 0; y < downscaling_factor; ++y) {
                                int new_x = ch * downscaling_factor * downscaling_factor + x * downscaling_factor + y;
                                int new_y = i * new_w + j;
                                int tmp_pos = new_x * new_w * new_h + new_y;
                                // Input: C, H, W
                                // Tmp: H*W/(downscaling_size^2), C * downscaling_size^2
                                tmp[i * ch_sum * downscaling_factor * downscaling_factor * new_w + j * ch_sum +
                                    downscaling_factor * downscaling_factor +
                                    ch * downscaling_factor * downscaling_factor + x * downscaling_factor + y] = input[
                                        ch * h * w + (i * downscaling_factor + x) * w + j * downscaling_factor + y];
                            }
                        }
                    }
                }
            }
            layer.forward(tmp, output);
        }